

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O2

void __thiscall slack::_detail::Slacking::setParameters(Slacking *this,string *method,string *data)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> complete_url;
  
  std::operator+(&complete_url,&this->base_url,method);
  std::__cxx11::string::_M_assign((string *)&(this->session_).url_);
  Session::SetBody(&this->session_,data);
  poVar1 = std::operator<<((ostream *)&std::cout,">> sending: ");
  poVar1 = std::operator<<(poVar1,(string *)&complete_url);
  poVar1 = std::operator<<(poVar1,"  ");
  poVar1 = std::operator<<(poVar1,(string *)data);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string((string *)&complete_url);
  return;
}

Assistant:

void setParameters(const std::string& method, const std::string& data = "") {
        auto complete_url =  base_url+ method;
        session_.SetUrl(complete_url);
        session_.SetBody(data);

#if SLACKING_VERBOSE_OUTPUT
        std::cout << ">> sending: "<< complete_url << "  " << data << '\n';
#endif

    }